

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gnutar_filename_encoding.c
# Opt level: O3

void test_gnutar_filename_encoding_KOI8R_CP866(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a;
  archive_entry *entry;
  size_t used;
  char buff [4096];
  size_t local_1040;
  undefined1 local_1038 [4104];
  
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                   ,L'v');
    test_skipping("KOI8-R locale not available on this system.");
    return;
  }
  a = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_gnutar((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_gnutar(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options((archive *)a,"hdrcharset=CP866");
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                   ,L'\x81');
    test_skipping("This system cannot convert character-set from KOI8-R to CP866.");
    archive_write_free((archive *)a);
    return;
  }
  iVar1 = archive_write_open_memory((archive *)a,local_1038,0x1000,&local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  entry = archive_entry_new2(a);
  archive_entry_set_pathname(entry,anon_var_dwarf_46084);
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_size(entry,0);
  iVar1 = archive_write_header((archive *)a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                      (void *)0x0);
  archive_entry_free(entry);
  iVar1 = archive_write_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'\x94',local_1038,"buff",anon_var_dwarf_45ff6,"\"\\xAF\\xE0\\xA8\"",3,"3",
                      (void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_gnutar_filename_encoding_KOI8R_CP866)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "ru_RU.KOI8-R")) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	/*
	 * Verify that KOI8-R filenames are correctly translated into CP866
	 * and stored with hdrcharset=CP866 option.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_gnutar(a));
	if (archive_write_set_options(a, "hdrcharset=CP866") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to CP866.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a KOI8-R filename. */
	archive_entry_set_pathname(entry, "\xD0\xD2\xC9");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Above three characters in KOI8-R should translate to the following
	 * three characters in CP866. */
	assertEqualMem(buff, "\xAF\xE0\xA8", 3);
}